

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_text.cpp
# Opt level: O0

void __thiscall GameText::GameText(GameText *this,string *text,uint8_t lines_in_textbox)

{
  uint8_t lines_in_textbox_local;
  string *text_local;
  GameText *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->_output_text);
  this->_current_line_length = 0;
  this->_current_line_count = '\0';
  this->_lines_in_textbox = lines_in_textbox;
  GameText::text(this,text);
  return;
}

Assistant:

GameText::GameText(const std::string& text, uint8_t lines_in_textbox) :
    _lines_in_textbox(lines_in_textbox)
{
    this->text(text);
}